

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ships.cpp
# Opt level: O0

map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
* __thiscall
Ships::EnumerateShips
          (map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
           *__return_storage_ptr__,Ships *this)

{
  bool bVar1;
  reference ppVar2;
  mapped_type *this_00;
  undefined1 local_80 [8];
  pair<const_int,_std::shared_ptr<Ship>_> ship;
  iterator __end1;
  iterator __begin1;
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  *__range1;
  int count;
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ships;
  Ships *this_local;
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  *ship_map;
  
  ships._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this;
  GetShips((map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
            *)&count,this);
  __range1._7_1_ = 0;
  std::
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ::map(__return_storage_ptr__);
  __range1._0_4_ = 0;
  __end1 = std::
           map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
           ::begin((map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
                    *)&count);
  ship.second.super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
       ::end((map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
              *)&count);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&ship.second.
                                                                                                      
                                                  super___shared_ptr<Ship,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<Ship>_>_>::operator*
                       (&__end1);
    std::pair<const_int,_std::shared_ptr<Ship>_>::pair
              ((pair<const_int,_std::shared_ptr<Ship>_> *)local_80,ppVar2);
    __range1._0_4_ = (int)__range1 + 1;
    this_00 = std::
              map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
              ::operator[](__return_storage_ptr__,(key_type *)&__range1);
    std::shared_ptr<Ship>::operator=(this_00,(shared_ptr<Ship> *)&ship);
    std::pair<const_int,_std::shared_ptr<Ship>_>::~pair
              ((pair<const_int,_std::shared_ptr<Ship>_> *)local_80);
    std::_Rb_tree_iterator<std::pair<const_int,_std::shared_ptr<Ship>_>_>::operator++(&__end1);
  }
  __range1._7_1_ = 1;
  std::
  map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
  ::~map((map<int,_std::shared_ptr<Ship>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<Ship>_>_>_>
          *)&count);
  return __return_storage_ptr__;
}

Assistant:

std::map<int, std::shared_ptr<Ship>> Ships::EnumerateShips() {
    auto ships = GetShips();
    std::map<int, std::shared_ptr<Ship>> ship_map;
    int count = 0;
    for(auto ship : ships) {
        count++;
        ship_map[count] = ship.second;
    }
    return ship_map;
}